

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::~QMainWindowLayout(QMainWindowLayout *this)

{
  QLayout *in_RDI;
  long in_FS_OFFSET;
  type bars;
  QList<QTabBar_*> *in_stack_ffffffffffffffa8;
  QMainWindowLayoutState *in_stack_ffffffffffffffb0;
  QMainWindowLayoutState *this_00;
  undefined1 *local_28;
  undefined1 *puStack_20;
  QMainWindow *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00d15ed8;
  (in_RDI->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QMainWindowLayout_00d15fe0;
  QMainWindowLayoutState::deleteAllLayoutItems(in_stack_ffffffffffffffb0);
  QMainWindowLayoutState::deleteCentralWidgetItem(in_stack_ffffffffffffffb0);
  if (*(long **)&in_RDI[0x38].field_0x8 != (long *)0x0) {
    (**(code **)(**(long **)&in_RDI[0x38].field_0x8 + 8))();
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QMainWindowLayoutState *)&local_28;
  QList<QTabBar_*>::QList((QList<QTabBar_*> *)this_00,in_stack_ffffffffffffffa8);
  qDeleteAll<QList<QTabBar*>>((QList<QTabBar_*> *)this_00);
  QList<QTabBar_*>::~QList((QList<QTabBar_*> *)0x5fb922);
  QPointer<QDockWidgetGroupWindow>::~QPointer((QPointer<QDockWidgetGroupWindow> *)0x5fb933);
  QPointer<QRubberBand>::~QPointer((QPointer<QRubberBand> *)0x5fb944);
  QList<int>::~QList((QList<int> *)0x5fb955);
  QWidgetAnimator::~QWidgetAnimator((QWidgetAnimator *)this_00);
  QBasicTimer::~QBasicTimer((QBasicTimer *)this_00);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x5fb988);
  QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x5fb999);
  QList<QTabBar_*>::~QList((QList<QTabBar_*> *)0x5fb9a3);
  QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x5fb9b4);
  std::unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_>::~unique_ptr
            ((unique_ptr<QMainWindowLayoutState,_std::default_delete<QMainWindowLayoutState>_> *)
             this_00);
  QMainWindowLayoutState::~QMainWindowLayoutState(this_00);
  QMainWindowLayoutState::~QMainWindowLayoutState(this_00);
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::~QMainWindowLayoutSeparatorHelper
            ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)this_00);
  QLayout::~QLayout(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMainWindowLayout::~QMainWindowLayout()
{
    layoutState.deleteAllLayoutItems();
    layoutState.deleteCentralWidgetItem();

    delete statusbar;

#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    // unusedTabBars contains unparented tab bars, which need to be removed manually.
    // ~QMainWindowTabBar() attempts to remove the bar from unusedTabBars
    // => move it out of the way first.
    const auto bars = std::move(unusedTabBars);
    qDeleteAll(bars);
#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
}